

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disassembler.cpp
# Opt level: O0

void __thiscall LLVMBC::StreamState::append(StreamState *this,MDNode *md,bool decl)

{
  uint uVar1;
  uint uVar2;
  MDOperand *md_00;
  uint64_t local_38;
  uint local_2c;
  uint64_t uStack_28;
  uint i;
  undefined1 local_19;
  MDNode *pMStack_18;
  bool decl_local;
  MDNode *md_local;
  StreamState *this_local;
  
  local_19 = decl;
  pMStack_18 = md;
  md_local = (MDNode *)this;
  if (md == (MDNode *)0x0) {
    append(this,"null");
  }
  else if (decl) {
    uStack_28 = MDNode::get_tween_id(md);
    append<char_const(&)[2],unsigned_long,char_const(&)[6]>
              (this,(char (*) [2])0x2a90e5,&stack0xffffffffffffffd8,(char (*) [6])" = !{");
    for (local_2c = 0; uVar2 = local_2c, uVar1 = MDNode::getNumOperands(pMStack_18), uVar2 < uVar1;
        local_2c = local_2c + 1) {
      md_00 = MDNode::getOperand(pMStack_18,local_2c);
      append(this,md_00);
      uVar2 = local_2c + 1;
      uVar1 = MDNode::getNumOperands(pMStack_18);
      if (uVar2 < uVar1) {
        append(this,", ");
      }
    }
    append(this,"}");
  }
  else {
    local_38 = MDNode::get_tween_id(md);
    append<char_const(&)[2],unsigned_long>(this,(char (*) [2])0x2a90e5,&local_38);
  }
  return;
}

Assistant:

void StreamState::append(MDNode *md, bool decl)
{
	if (md)
	{
		if (decl)
		{
			append("!", md->get_tween_id(), " = !{");
			for (unsigned i = 0; i < md->getNumOperands(); i++)
			{
				append(&md->getOperand(i));
				if (i + 1 < md->getNumOperands())
					append(", ");
			}
			append("}");
		}
		else
			append("!", md->get_tween_id());
	}
	else
		append("null");
}